

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O0

string * __thiscall xLearn::Reader::check_file_format_abi_cxx11_(Reader *this)

{
  ulong uVar1;
  char *pcVar2;
  ostream *poVar3;
  reference pvVar4;
  ulong uVar5;
  long in_RSI;
  string *in_RDI;
  char *in_stack_00000028;
  char *in_stack_00000030;
  string *in_stack_00000068;
  FILE *in_stack_00000070;
  int i_1;
  int count;
  size_t found;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str_list;
  size_t i;
  int comma_count;
  int table_count;
  int space_count;
  string data_line;
  FILE *file;
  allocator *out;
  allocator *in_stack_fffffffffffffe70;
  string *function;
  string *this_00;
  LogSeverity in_stack_fffffffffffffef4;
  string local_108 [38];
  allocator local_e2;
  allocator local_e1;
  undefined4 local_e0;
  allocator local_d9;
  int local_d8;
  int local_d4;
  long local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  allocator local_a9;
  string local_a8 [24];
  FILE *in_stack_ffffffffffffff70;
  allocator local_81;
  string local_80 [36];
  Logger local_5c;
  ulong local_58;
  int local_50;
  int local_4c;
  int local_48;
  string local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  string *in_stack_ffffffffffffffe0;
  
  function = in_RDI;
  std::__cxx11::string::c_str();
  OpenFileOrDie(in_stack_00000030,in_stack_00000028);
  this_00 = local_38;
  std::__cxx11::string::string(this_00);
  GetLine(in_stack_00000070,in_stack_00000068);
  Close(in_stack_ffffffffffffff70);
  local_48 = 0;
  local_4c = 0;
  local_50 = 0;
  for (local_58 = 0; uVar5 = local_58, uVar1 = std::__cxx11::string::size(), uVar5 < uVar1;
      local_58 = local_58 + 1) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    if (*pcVar2 == ' ') {
      local_48 = local_48 + 1;
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
      if (*pcVar2 == '\t') {
        local_4c = local_4c + 1;
      }
      else {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
        if (*pcVar2 == ',') {
          local_50 = local_50 + 1;
        }
      }
    }
  }
  if ((local_4c < local_48) && (local_50 < local_48)) {
    std::__cxx11::string::operator=((string *)(in_RSI + 0xa0)," ");
  }
  else if ((local_48 < local_4c) && (local_50 < local_4c)) {
    std::__cxx11::string::operator=((string *)(in_RSI + 0xa0),"\t");
  }
  else if ((local_48 < local_50) && (local_4c < local_50)) {
    std::__cxx11::string::operator=((string *)(in_RSI + 0xa0),",");
  }
  else {
    Logger::Logger(&local_5c,FATAL);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/reader.cc"
               ,&local_81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"check_file_format",&local_a9);
    poVar3 = Logger::Start(in_stack_fffffffffffffef4,(string *)this_00,(int)((ulong)in_RSI >> 0x20),
                           (string *)function);
    std::operator<<(poVar3,"File format error!");
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    Logger::~Logger((Logger *)in_stack_fffffffffffffe70);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1bdad6);
  std::__cxx11::string::c_str();
  SplitStringUsing(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&local_c8,0);
  local_d0 = std::__cxx11::string::find((char *)pvVar4,0x214bdc);
  if (local_d0 == -1) {
    *(undefined1 *)(in_RSI + 0x98) = 1;
  }
  else {
    *(undefined1 *)(in_RSI + 0x98) = 0;
  }
  local_d4 = 0;
  local_d8 = 0;
  while( true ) {
    uVar5 = (ulong)local_d8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_c8,1);
    uVar1 = std::__cxx11::string::size();
    if (uVar1 <= uVar5) break;
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_c8,1);
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)pvVar4);
    if (*pcVar2 == ':') {
      local_d4 = local_d4 + 1;
    }
    local_d8 = local_d8 + 1;
  }
  if (local_d4 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"libsvm",&local_d9);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  }
  else if (local_d4 == 2) {
    in_stack_fffffffffffffe70 = &local_e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"libffm",in_stack_fffffffffffffe70);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  }
  else {
    if (local_d4 != 0) {
      out = (allocator *)&stack0xfffffffffffffef7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_108,"Unknow file format",out);
      Color::print_error((string *)out);
      std::__cxx11::string::~string(local_108);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffef7);
      exit(0);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"csv",&local_e2);
    std::allocator<char>::~allocator((allocator<char> *)&local_e2);
  }
  local_e0 = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffe70);
  std::__cxx11::string::~string(local_38);
  return function;
}

Assistant:

std::string Reader::check_file_format() {
#ifndef _MSC_VER
  FILE* file = OpenFileOrDie(filename_.c_str(), "r");
#else
  FILE* file = OpenFileOrDie(filename_.c_str(), "rb");
#endif
  // get the first line of data
  std::string data_line;
  GetLine(file, data_line);
  Close(file);
  // Find the split string
  int space_count = 0;
  int table_count = 0;
  int comma_count = 0;
  for (size_t i = 0; i < data_line.size(); ++i) {
    if (data_line[i] == ' ') {
      space_count++;
    } else if (data_line[i] == '\t') {
      table_count++;
    } else if (data_line[i] == ',') {
      comma_count++;
    }
  }
  if (space_count > table_count && 
      space_count > comma_count) {
    splitor_ = " ";
  } else if (table_count > space_count &&
             table_count > comma_count) {
    splitor_ = "\t";
  } else if (comma_count > space_count &&
             comma_count > table_count) {
    splitor_ = ",";
  } else {
    LOG(FATAL) << "File format error!";
  }
  // Split the first line of data
  std::vector<std::string> str_list;
  SplitStringUsing(data_line, splitor_.c_str(), &str_list);
  // has y?
  size_t found = str_list[0].find(":");
  if (found != std::string::npos) {  // find ":", no label
    has_label_ = false;
  } else {
    has_label_ = true;
  }
  // check file format
  int count = 0;
  for (int i = 0; i < str_list[1].size(); ++i) {
    if (str_list[1][i] == ':') {
      count++;
    }
  }
  if (count == 1) {
    return "libsvm";
  } else if (count == 2) {
    return "libffm";
  } else if (count == 0){
    return "csv";
  }
  Color::print_error("Unknow file format");
  exit(0);
}